

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O0

path * getFullPathName(path *__return_storage_ptr__,path *path)

{
  bool bVar1;
  path local_b0;
  path local_80;
  path local_60;
  path local_40;
  path *local_20;
  path *source;
  path *path_local;
  
  source = path;
  path_local = __return_storage_ptr__;
  if ((Global.relativeInclude) && (bVar1 = ghc::filesystem::path::is_absolute(path), !bVar1)) {
    local_20 = FileList::path(&Global.fileList,Global.FileInfo.FileNum);
    ghc::filesystem::path::parent_path(&local_80,local_20);
    ghc::filesystem::operator/(&local_60,&local_80,source);
    ghc::filesystem::absolute(&local_40,&local_60);
    ghc::filesystem::path::lexically_normal(__return_storage_ptr__,&local_40);
    ghc::filesystem::path::~path(&local_40);
    ghc::filesystem::path::~path(&local_60);
    ghc::filesystem::path::~path(&local_80);
    return __return_storage_ptr__;
  }
  ghc::filesystem::absolute(&local_b0,source);
  ghc::filesystem::path::lexically_normal(__return_storage_ptr__,&local_b0);
  ghc::filesystem::path::~path(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

fs::path getFullPathName(const fs::path& path)
{
	if (Global.relativeInclude && !path.is_absolute())
	{
		const fs::path &source = Global.fileList.path(Global.FileInfo.FileNum);
		return fs::absolute(source.parent_path() / path).lexically_normal();
	}
	else
	{
		return fs::absolute(path).lexically_normal();
	}
}